

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint readChunk_tEXt(LodePNGInfo *info,uchar *data,size_t chunkLength)

{
  char *key;
  char *str;
  ulong __size;
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = 1;
  while( true ) {
    uVar1 = (ulong)(uVar3 - 1);
    if ((chunkLength <= uVar1) || (data[uVar1] == '\0')) break;
    uVar3 = uVar3 + 1;
  }
  if (uVar3 - 0x51 < 0xffffffb1) {
    key = (char *)0x0;
    uVar3 = 0x59;
    str = (char *)0x0;
  }
  else {
    __size = (ulong)uVar3;
    key = (char *)malloc(__size);
    if (key == (char *)0x0) {
      key = (char *)0x0;
    }
    else {
      key[uVar1] = '\0';
      for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
        key[uVar2] = data[uVar2];
      }
      uVar4 = (int)chunkLength - uVar3;
      if (chunkLength < __size) {
        uVar4 = 0;
      }
      str = (char *)malloc((ulong)(uVar4 + 1));
      if (str != (char *)0x0) {
        str[uVar4] = '\0';
        if (chunkLength < __size) {
          __size = chunkLength;
        }
        for (uVar1 = 0; (uint)((int)chunkLength - (int)__size) != uVar1; uVar1 = uVar1 + 1) {
          str[uVar1] = data[uVar3];
          uVar3 = uVar3 + 1;
        }
        uVar3 = lodepng_add_text(info,key,str);
        goto LAB_0011313e;
      }
    }
    str = (char *)0x0;
    uVar3 = 0x53;
  }
LAB_0011313e:
  free(key);
  free(str);
  return uVar3;
}

Assistant:

static unsigned readChunk_tEXt(LodePNGInfo* info, const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;
  char *key = 0, *str = 0;
  unsigned i;

  while(!error) /*not really a while loop, only used to break on error*/ {
    unsigned length, string2_begin;

    length = 0;
    while(length < chunkLength && data[length] != 0) ++length;
    /*even though it's not allowed by the standard, no error is thrown if
    there's no null termination char, if the text is empty*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    key[length] = 0;
    for(i = 0; i != length; ++i) key[i] = (char)data[i];

    string2_begin = length + 1; /*skip keyword null terminator*/

    length = (unsigned)(chunkLength < string2_begin ? 0 : chunkLength - string2_begin);
    str = (char*)lodepng_malloc(length + 1);
    if(!str) CERROR_BREAK(error, 83); /*alloc fail*/

    str[length] = 0;
    for(i = 0; i != length; ++i) str[i] = (char)data[string2_begin + i];

    error = lodepng_add_text(info, key, str);

    break;
  }

  lodepng_free(key);
  lodepng_free(str);

  return error;
}